

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

BufferOrError * __thiscall
slang::SourceManager::openCached
          (BufferOrError *__return_storage_ptr__,SourceManager *this,path *fullPath,
          SourceLocation includedFrom,SourceLibrary *library,uint64_t sortKey)

{
  flat_hash_map<std::string,_std::pair<std::unique_ptr<FileData>,_std::error_code>_> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  char *pcVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  error_category *peVar6;
  uint uVar7;
  byte bVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  byte bVar13;
  uchar uVar14;
  _Alloc_hider _Var15;
  size_type sVar16;
  _List _Var17;
  undefined8 uVar18;
  int iVar19;
  uint uVar20;
  uint64_t uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  value_type_pointer ppVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  error_code eVar29;
  unique_lock<std::shared_mutex> *in_stack_fffffffffffffe28;
  try_emplace_args_t local_1c1;
  SourceLocation local_1c0;
  error_category *local_1b8;
  uint64_t local_1b0;
  SourceLibrary *local_1a8;
  BufferOrError *local_1a0;
  string pathStr;
  unique_lock<std::shared_mutex> lock;
  SourceLibrary *local_138;
  undefined8 uStack_130;
  unique_lock<std::shared_mutex> lock_1;
  path absPath;
  pair<std::nullptr_t,_std::error_code> local_b0;
  SmallVector<char,_40UL> buffer;
  
  local_1c0 = includedFrom;
  std::filesystem::__cxx11::path::path(&absPath);
  if (this->disableProximatePaths == false) {
    pathStr._M_dataplus._M_p = (pointer)((ulong)pathStr._M_dataplus._M_p._4_4_ << 0x20);
    pathStr._M_string_length = std::_V2::system_category();
    std::filesystem::weakly_canonical((path *)&buffer,(error_code *)fullPath);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&absPath._M_pathname,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer);
    uVar18 = buffer._32_8_;
    _Var17 = absPath._M_cmpts;
    buffer._32_8_ = 0;
    absPath._M_cmpts._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )uVar18;
    if (_Var17._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&absPath._M_cmpts,
                 (_Impl *)_Var17._M_impl._M_t.
                          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                          .
                          super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                          ._M_head_impl);
    }
    std::filesystem::__cxx11::path::clear((path *)&buffer);
    std::filesystem::__cxx11::path::~path((path *)&buffer);
    if ((int)pathStr._M_dataplus._M_p != 0) {
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .m_has_value = false;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_error._M_value = (int)pathStr._M_dataplus._M_p;
      (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
      .field_0.m_value.data._M_str = (char *)pathStr._M_string_length;
      goto LAB_00216704;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&absPath,fullPath);
  }
  pathStr._M_dataplus._M_p = (pointer)&pathStr.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pathStr,absPath._M_pathname._M_dataplus._M_p,
             absPath._M_pathname._M_dataplus._M_p + absPath._M_pathname._M_string_length);
  lock._M_owns = false;
  local_1b0 = sortKey;
  local_1a8 = library;
  local_1a0 = __return_storage_ptr__;
  lock._M_device = &this->mutex;
  std::unique_lock<std::shared_mutex>::lock(&lock);
  lock._M_owns = true;
  arrays_ = &this->lookupCache;
  uVar21 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                         *)arrays_,&pathStr);
  sVar16 = pathStr._M_string_length;
  _Var15 = pathStr._M_dataplus;
  uVar22 = uVar21 >> ((byte)(this->lookupCache).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.groups_;
  lVar23 = (uVar21 & 0xff) * 4;
  uVar10 = (&UNK_0048f58c)[lVar23];
  uVar11 = (&UNK_0048f58d)[lVar23];
  uVar12 = (&UNK_0048f58e)[lVar23];
  bVar13 = (&UNK_0048f58f)[lVar23];
  ppVar5 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.elements_;
  uVar26 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.groups_size_mask;
  uVar24 = 0;
  do {
    pgVar2 = pgVar4 + uVar22;
    bVar8 = pgVar2->m[0xf].n;
    auVar27[0] = -(pgVar2->m[0].n == uVar10);
    auVar27[1] = -(pgVar2->m[1].n == uVar11);
    auVar27[2] = -(pgVar2->m[2].n == uVar12);
    auVar27[3] = -(pgVar2->m[3].n == bVar13);
    auVar27[4] = -(pgVar2->m[4].n == uVar10);
    auVar27[5] = -(pgVar2->m[5].n == uVar11);
    auVar27[6] = -(pgVar2->m[6].n == uVar12);
    auVar27[7] = -(pgVar2->m[7].n == bVar13);
    auVar27[8] = -(pgVar2->m[8].n == uVar10);
    auVar27[9] = -(pgVar2->m[9].n == uVar11);
    auVar27[10] = -(pgVar2->m[10].n == uVar12);
    auVar27[0xb] = -(pgVar2->m[0xb].n == bVar13);
    auVar27[0xc] = -(pgVar2->m[0xc].n == uVar10);
    auVar27[0xd] = -(pgVar2->m[0xd].n == uVar11);
    auVar27[0xe] = -(pgVar2->m[0xe].n == uVar12);
    auVar27[0xf] = -(bVar8 == bVar13);
    uVar20 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe);
    while (uVar20 != 0) {
      local_1b8 = (error_category *)(ulong)uVar20;
      uVar7 = 0;
      if (uVar20 != 0) {
        for (; (uVar20 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      if ((sVar16 == ppVar5[uVar22 * 0xf + (ulong)uVar7].first._M_string_length) &&
         ((ppVar25 = ppVar5 + uVar22 * 0xf + (ulong)uVar7, sVar16 == 0 ||
          (iVar19 = bcmp(_Var15._M_p,(ppVar25->first)._M_dataplus._M_p,sVar16), iVar19 == 0)))) {
        iVar19 = (ppVar25->second).second._M_value;
        if (iVar19 == 0) {
          createBufferEntry((SourceBuffer *)&buffer,this,
                            (ppVar25->second).first._M_t.
                            super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                            .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>.
                            _M_head_impl,local_1c0,local_1a8,local_1b0,in_stack_fffffffffffffe28);
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
          m_has_value = true;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
          m_value.data._M_len = (size_t)buffer.super_SmallVectorBase<char>.data_;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
          m_value.data._M_str = (char *)buffer.super_SmallVectorBase<char>.len;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
          m_value.library = (SourceLibrary *)buffer.super_SmallVectorBase<char>.cap;
          *(undefined8 *)
           ((long)&(local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>
                   .field_0 + 0x18) = buffer.super_SmallVectorBase<char>._24_8_;
        }
        else {
          peVar6 = (ppVar25->second).second._M_cat;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
          m_has_value = false;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
          m_error._M_value = iVar19;
          (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
          m_value.data._M_str = (char *)peVar6;
        }
        __return_storage_ptr__ = local_1a0;
        std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
        goto LAB_002166ed;
      }
      uVar20 = (uint)local_1b8 - 1 & (uint)local_1b8;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & bVar8) == 0) break;
    lVar23 = uVar22 + uVar24;
    uVar24 = uVar24 + 1;
    uVar22 = lVar23 + 1U & uVar26;
  } while (uVar24 <= uVar26);
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  pcVar3 = buffer.super_SmallVectorBase<char>.firstElement;
  buffer.super_SmallVectorBase<char>.len = 0;
  buffer.super_SmallVectorBase<char>.cap = 0x28;
  buffer.super_SmallVectorBase<char>.data_ = pcVar3;
  eVar29 = OS::readFile(&absPath,&buffer);
  __return_storage_ptr__ = local_1a0;
  local_1b8 = eVar29._M_cat;
  if (eVar29._M_value == 0) {
    cacheBuffer((SourceBuffer *)&lock,this,&absPath,&pathStr,local_1c0,local_1a8,local_1b0,&buffer);
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    m_has_value = true;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.data._M_len = (size_t)lock._M_device;
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.data._M_str = (char *)CONCAT71(lock._9_7_,lock._M_owns);
    (__return_storage_ptr__->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
    field_0.m_value.library = local_138;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->contained).
             super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0 + 0x18) = uStack_130
    ;
  }
  else {
    local_1c0._0_4_ = eVar29._M_value;
    lock_1._M_owns = false;
    lock_1._M_device = &this->mutex;
    std::unique_lock<std::shared_mutex>::lock(&lock_1);
    lock_1._M_owns = true;
    local_b0.first = (void *)0x0;
    local_b0.second._M_value = local_1c0._0_4_;
    local_b0.second._M_cat = local_1b8;
    uVar21 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)arrays_,&pathStr);
    sVar16 = pathStr._M_string_length;
    _Var15 = pathStr._M_dataplus;
    uVar24 = uVar21 >> ((byte)(this->lookupCache).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    pgVar4 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.groups_;
    lVar23 = (uVar21 & 0xff) * 4;
    uVar10 = (&UNK_0048f58c)[lVar23];
    uVar11 = (&UNK_0048f58d)[lVar23];
    uVar12 = (&UNK_0048f58e)[lVar23];
    uVar14 = (&UNK_0048f58f)[lVar23];
    ppVar5 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.elements_;
    local_1b0 = (this->lookupCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                .arrays.groups_size_mask;
    uVar22 = 0;
    uVar26 = uVar24;
    do {
      pgVar2 = pgVar4 + uVar26;
      uVar9 = pgVar2->m[0xf].n;
      auVar28[0] = -(pgVar2->m[0].n == uVar10);
      auVar28[1] = -(pgVar2->m[1].n == uVar11);
      auVar28[2] = -(pgVar2->m[2].n == uVar12);
      auVar28[3] = -(pgVar2->m[3].n == uVar14);
      auVar28[4] = -(pgVar2->m[4].n == uVar10);
      auVar28[5] = -(pgVar2->m[5].n == uVar11);
      auVar28[6] = -(pgVar2->m[6].n == uVar12);
      auVar28[7] = -(pgVar2->m[7].n == uVar14);
      auVar28[8] = -(pgVar2->m[8].n == uVar10);
      auVar28[9] = -(pgVar2->m[9].n == uVar11);
      auVar28[10] = -(pgVar2->m[10].n == uVar12);
      auVar28[0xb] = -(pgVar2->m[0xb].n == uVar14);
      auVar28[0xc] = -(pgVar2->m[0xc].n == uVar10);
      auVar28[0xd] = -(pgVar2->m[0xd].n == uVar11);
      auVar28[0xe] = -(pgVar2->m[0xe].n == uVar12);
      auVar28[0xf] = -(uVar9 == uVar14);
      local_1a8 = (SourceLibrary *)CONCAT71(local_1a8._1_7_,uVar9);
      for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
          uVar20 = uVar20 - 1 & uVar20) {
        uVar7 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        if ((sVar16 == ppVar5[uVar26 * 0xf + (ulong)uVar7].first._M_string_length) &&
           ((sVar16 == 0 ||
            (iVar19 = bcmp(_Var15._M_p,ppVar5[uVar26 * 0xf + (ulong)uVar7].first._M_dataplus._M_p,
                           sVar16), iVar19 == 0)))) goto LAB_00216950;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar21 & 7] & (byte)local_1a8) == 0)
      break;
      lVar23 = uVar26 + uVar22;
      uVar22 = uVar22 + 1;
      uVar26 = lVar23 + 1U & local_1b0;
    } while (uVar22 <= local_1b0);
    if ((this->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.size <
        (this->lookupCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                ((locator *)&lock,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                  *)arrays_,(arrays_type *)arrays_,uVar24,uVar21,&local_1c1,&pathStr,&local_b0);
      psVar1 = &(this->lookupCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::__cxx11::string&,std::pair<decltype(nullptr),std::error_code>>
                ((locator *)&lock,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::__cxx11::string,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>,std::error_code>>>>
                  *)arrays_,uVar21,&local_1c1,&pathStr,&local_b0);
    }
LAB_00216950:
    __return_storage_ptr__ = local_1a0;
    (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value =
         false;
    (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
    m_error._M_value = local_1c0._0_4_;
    (local_1a0->contained).super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
    m_value.data._M_str = (char *)local_1b8;
    std::unique_lock<std::shared_mutex>::~unique_lock(&lock_1);
  }
  if (buffer.super_SmallVectorBase<char>.data_ != pcVar3) {
    operator_delete(buffer.super_SmallVectorBase<char>.data_);
  }
LAB_002166ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pathStr._M_dataplus._M_p != &pathStr.field_2) {
    operator_delete(pathStr._M_dataplus._M_p,pathStr.field_2._M_allocated_capacity + 1);
  }
LAB_00216704:
  std::filesystem::__cxx11::path::~path(&absPath);
  return __return_storage_ptr__;
}

Assistant:

SourceManager::BufferOrError SourceManager::openCached(const fs::path& fullPath,
                                                       SourceLocation includedFrom,
                                                       const SourceLibrary* library,
                                                       uint64_t sortKey) {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(fullPath, ec);
        if (ec)
            return nonstd::make_unexpected(ec);
    }
    else {
        absPath = fullPath;
    }

    // first see if we have this file cached
    std::string pathStr = getU8Str(absPath);
    {
        std::unique_lock<std::shared_mutex> lock(mutex);
        auto it = lookupCache.find(pathStr);
        if (it != lookupCache.end()) {
            auto& [fd, ec] = it->second;
            if (ec)
                return nonstd::make_unexpected(ec);

            SLANG_ASSERT(fd);
            return createBufferEntry(fd.get(), includedFrom, library, sortKey, lock);
        }
    }

    // do the read
    SmallVector<char> buffer;
    if (std::error_code ec = OS::readFile(absPath, buffer)) {
        std::unique_lock<std::shared_mutex> lock(mutex);
        lookupCache.emplace(pathStr, std::pair{nullptr, ec});
        return nonstd::make_unexpected(ec);
    }

    return cacheBuffer(std::move(absPath), std::move(pathStr), includedFrom, library, sortKey,
                       std::move(buffer));
}